

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperDefinitions.h
# Opt level: O1

string * helper::int_to_hex<unsigned_short>(string *__return_storage_ptr__,unsigned_short i)

{
  long lVar1;
  char cVar2;
  stringstream stream;
  undefined1 auStack_1a8 [8];
  stringstream local_1a0 [16];
  long local_190 [2];
  undefined8 uStack_180;
  uint auStack_178 [22];
  ios_base local_120 [112];
  char acStack_b0 [152];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  lVar1 = *(long *)(local_190[0] + -0x18);
  if (acStack_b0[lVar1 + 1] == '\0') {
    cVar2 = std::ios::widen((char)auStack_1a8 + (char)lVar1 + '\x18');
    acStack_b0[lVar1] = cVar2;
    acStack_b0[lVar1 + 1] = '\x01';
  }
  acStack_b0[lVar1] = '0';
  *(undefined8 *)((long)&uStack_180 + *(long *)(local_190[0] + -0x18)) = 4;
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string int_to_hex( T i )
	{
		std::stringstream stream;
		stream << std::setfill( '0' ) << std::setw( sizeof( T ) * 2 )
			<< std::hex << i;
		return stream.str();
	}